

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

string * Catch::
         StringMaker<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
         ::convert(string *__return_storage_ptr__,string *str)

{
  size_type sVar1;
  pointer pcVar2;
  undefined8 uVar3;
  char cVar4;
  undefined **ppuVar5;
  undefined8 *puVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar7;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar8;
  char *__s;
  size_type sVar9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  if (IMutableContext::currentContext == (undefined8 *)0x0) {
    IMutableContext::currentContext = (undefined8 *)operator_new(0x30);
    ppuVar5 = &PTR__Context_00188cc0;
    *IMutableContext::currentContext = &PTR__Context_00188cc0;
    IMutableContext::currentContext[1] = &PTR__Context_00188d10;
    IMutableContext::currentContext[2] = 0;
    IMutableContext::currentContext[3] = 0;
    IMutableContext::currentContext[4] = 0;
    IMutableContext::currentContext[5] = 0;
  }
  else {
    ppuVar5 = (undefined **)*IMutableContext::currentContext;
  }
  puVar6 = (undefined8 *)(*(code *)ppuVar5[4])();
  cVar4 = (**(code **)(*(long *)*puVar6 + 0x50))();
  if (cVar4 == '\0') {
    std::operator+(&local_50,'\"',str);
    pbVar7 = clara::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
             ::_M_replace_aux(&local_50,local_50._M_string_length,0,1,'\"');
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = (pbVar7->_M_dataplus)._M_p;
    paVar8 = &pbVar7->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar2 == paVar8) {
      uVar3 = *(undefined8 *)((long)&pbVar7->field_2 + 8);
      (__return_storage_ptr__->field_2)._M_allocated_capacity = paVar8->_M_allocated_capacity;
      *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uVar3;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = pcVar2;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = paVar8->_M_allocated_capacity;
    }
    __return_storage_ptr__->_M_string_length = pbVar7->_M_string_length;
    (pbVar7->_M_dataplus)._M_p = (pointer)paVar8;
    pbVar7->_M_string_length = 0;
    (pbVar7->field_2)._M_local_buf[0] = '\0';
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"\"","");
    sVar1 = str->_M_string_length;
    if (sVar1 != 0) {
      pcVar2 = (str->_M_dataplus)._M_p;
      sVar9 = 0;
      do {
        cVar4 = pcVar2[sVar9];
        __s = "\\t";
        if (cVar4 == '\t') {
LAB_00128c04:
          clara::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          append(__return_storage_ptr__,__s);
        }
        else {
          if (cVar4 == '\n') {
            __s = "\\n";
            goto LAB_00128c04;
          }
          clara::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          push_back(__return_storage_ptr__,cVar4);
        }
        sVar9 = sVar9 + 1;
      } while (sVar1 != sVar9);
    }
    clara::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              (__return_storage_ptr__,"\"");
  }
  return __return_storage_ptr__;
}

Assistant:

std::string StringMaker<std::string>::convert(const std::string& str) {
    if (!getCurrentContext().getConfig()->showInvisibles()) {
        return '"' + str + '"';
    }

    std::string s("\"");
    for (char c : str) {
        switch (c) {
        case '\n':
            s.append("\\n");
            break;
        case '\t':
            s.append("\\t");
            break;
        default:
            s.push_back(c);
            break;
        }
    }
    s.append("\"");
    return s;
}